

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

LegacyScriptPubKeyMan * __thiscall wallet::CWallet::GetLegacyScriptPubKeyMan(CWallet *this)

{
  const_iterator cVar1;
  LegacyScriptPubKeyMan *pLVar2;
  long in_FS_OFFSET;
  key_type local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
    local_14 = LEGACY;
    cVar1 = std::
            _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
            ::find(&(this->m_internal_spk_managers)._M_t,&local_14);
    if (((_Rb_tree_header *)cVar1._M_node !=
         &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header) &&
       (cVar1._M_node[1]._M_parent != (_Base_ptr)0x0)) {
      pLVar2 = (LegacyScriptPubKeyMan *)
               __dynamic_cast(cVar1._M_node[1]._M_parent,&ScriptPubKeyMan::typeinfo,
                              &LegacyScriptPubKeyMan::typeinfo,0);
      goto LAB_004581fe;
    }
  }
  pLVar2 = (LegacyScriptPubKeyMan *)0x0;
LAB_004581fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pLVar2;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan* CWallet::GetLegacyScriptPubKeyMan() const
{
    if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return nullptr;
    }
    // Legacy wallets only have one ScriptPubKeyMan which is a LegacyScriptPubKeyMan.
    // Everything in m_internal_spk_managers and m_external_spk_managers point to the same legacyScriptPubKeyMan.
    auto it = m_internal_spk_managers.find(OutputType::LEGACY);
    if (it == m_internal_spk_managers.end()) return nullptr;
    return dynamic_cast<LegacyScriptPubKeyMan*>(it->second);
}